

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

void __thiscall
rtosc::ClonePorts::ClonePorts(ClonePorts *this,Ports *ports_,initializer_list<rtosc::ClonePort> c)

{
  pointer pPVar1;
  int iVar2;
  uint uVar3;
  iterator pCVar4;
  Port *p;
  pointer pPVar5;
  iterator pCVar6;
  pointer pPVar7;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *__range2;
  Port local_68;
  
  pCVar4 = c._M_array;
  Ports::Ports(&this->super_Ports,(initializer_list<rtosc::Port>)ZEXT816(0));
  pCVar6 = pCVar4 + c._M_len;
  for (; pCVar4 != pCVar6; pCVar4 = pCVar4 + 1) {
    pPVar1 = (ports_->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pPVar7 = (pointer)0x0;
    for (pPVar5 = (ports_->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                  _M_impl.super__Vector_impl_data._M_start; pPVar5 != pPVar1; pPVar5 = pPVar5 + 1) {
      iVar2 = strcmp(pPVar5->name,pCVar4->name);
      if (iVar2 == 0) {
        pPVar7 = pPVar5;
      }
    }
    if (pPVar7 == (pointer)0x0) {
      uVar3 = (byte)*pCVar4->name - 0x2a;
      if (uVar3 == 0) {
        uVar3 = (uint)(byte)pCVar4->name[1];
      }
      if (uVar3 != 0) {
        fprintf(_stderr,"Cannot find a clone port for \'%s\'\n");
      }
      std::function<void_(const_char_*,_rtosc::RtData_&)>::operator=
                (&(this->super_Ports).default_handler,&pCVar4->cb);
    }
    else {
      local_68.name = pPVar7->name;
      local_68.metadata = pPVar7->metadata;
      local_68.ports = pPVar7->ports;
      std::function<void_(const_char_*,_rtosc::RtData_&)>::function(&local_68.cb,&pCVar4->cb);
      std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::emplace_back<rtosc::Port>
                ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)this,&local_68);
      std::_Function_base::~_Function_base(&local_68.cb.super__Function_base);
    }
  }
  Ports::refreshMagic(&this->super_Ports);
  return;
}

Assistant:

ClonePorts::ClonePorts(const Ports &ports_,
        std::initializer_list<ClonePort> c)
    :Ports({})
{
    for(auto &to_clone:c) {
        const Port *clone_port = NULL;
        for(auto &p:ports_.ports)
            if(!strcmp(p.name, to_clone.name))
                clone_port = &p;
        if(!clone_port && strcmp("*", to_clone.name)) {
            fprintf(stderr, "Cannot find a clone port for '%s'\n",to_clone.name);
            assert(false);
        }

        if(clone_port) {
            ports.push_back({clone_port->name, clone_port->metadata,
                    clone_port->ports, to_clone.cb});
        } else {
            default_handler = to_clone.cb;
        }
    }

    refreshMagic();
}